

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O0

int __thiscall
QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
::remove(QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
         *this,char *__filename)

{
  bool bVar1;
  undefined7 extraout_var;
  QPushButton **unaff_retaddr;
  QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
  *in_stack_00000008;
  undefined1 in_stack_00000020 [16];
  
  find(in_stack_00000008,unaff_retaddr);
  bVar1 = do_remove((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                     *)__filename,(iterator)in_stack_00000020);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool remove(const Key &key)
    {
        return do_remove(find(key));
    }